

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void libtorrent::aux::anon_unknown_119::on_dht_put_mutable_item
               (alert_manager *alerts,item *i,int num)

{
  pointer pcVar1;
  string salt;
  sequence_number seq;
  public_key pk;
  signature sig;
  int local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  int64_t local_a0;
  array<char,_32UL> local_98;
  array<char,_64UL> local_78;
  
  if (((alerts->m_alert_mask)._M_i.m_val >> 10 & 1) != 0) {
    local_78._M_elems._0_8_ = *(undefined8 *)(i->m_sig).bytes._M_elems;
    local_78._M_elems._8_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 8);
    local_78._M_elems._16_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x10);
    local_78._M_elems._24_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x18);
    local_78._M_elems._32_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x20);
    local_78._M_elems._36_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x24);
    local_78._M_elems._40_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x28);
    local_78._M_elems._44_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x2c);
    local_78._M_elems._48_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x30);
    local_78._M_elems._52_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x34);
    local_78._M_elems._56_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x38);
    local_78._M_elems._60_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x3c);
    local_98._M_elems._0_4_ = *(undefined4 *)(i->m_pk).bytes._M_elems;
    local_98._M_elems._4_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 4);
    local_98._M_elems._8_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 8);
    local_98._M_elems._12_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 0xc);
    local_98._M_elems._16_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 0x10);
    local_98._M_elems._20_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 0x14);
    local_98._M_elems._24_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 0x18);
    local_98._M_elems._28_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 0x1c);
    local_a0 = (i->m_seq).value;
    pcVar1 = (i->m_salt)._M_dataplus._M_p;
    local_c4 = num;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + (i->m_salt)._M_string_length);
    alert_manager::
    emplace_alert<libtorrent::dht_put_alert,std::array<char,32ul>const&,std::array<char,64ul>const&,std::__cxx11::string,long_const&,int&>
              (alerts,&local_98,&local_78,&local_c0,&local_a0,&local_c4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void on_dht_put_mutable_item(aux::alert_manager& alerts, dht::item const& i, int num)
		{
			if (alerts.should_post<dht_put_alert>())
			{
				dht::signature const sig = i.sig();
				dht::public_key const pk = i.pk();
				dht::sequence_number const seq = i.seq();
				std::string salt = i.salt();
				alerts.emplace_alert<dht_put_alert>(pk.bytes, sig.bytes
					, std::move(salt), seq.value, num);
			}
		}